

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O0

void __thiscall f8n::runtime::MessageQueue::~MessageQueue(MessageQueue *this)

{
  MessageQueue *this_local;
  
  (this->super_IMessageQueue)._vptr_IMessageQueue = (_func_int **)&PTR__MessageQueue_00315748;
  std::_V2::condition_variable_any::~condition_variable_any(&this->waitForDispatch);
  std::
  set<f8n::runtime::IMessageTarget_*,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
  ::~set(&this->targets);
  std::
  set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  ::~set(&this->receivers);
  std::__cxx11::
  list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  ::~list(&this->dispatch);
  std::__cxx11::
  list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  ::~list(&this->queue);
  IMessageQueue::~IMessageQueue(&this->super_IMessageQueue);
  return;
}

Assistant:

MessageQueue::~MessageQueue() {

}